

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

int Abc_SopIsOrType(char *pSop)

{
  int iVar1;
  int iVar2;
  int local_30;
  int nLits;
  int nVars;
  char *pCur;
  char *pCube;
  char *pSop_local;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  iVar2 = Abc_SopGetCubeNum(pSop);
  pCur = pSop;
  if (iVar1 == iVar2) {
    for (; *pCur != '\0'; pCur = pCur + (iVar1 + 3)) {
      local_30 = 0;
      for (_nLits = pCur; *_nLits != ' '; _nLits = _nLits + 1) {
        local_30 = (uint)(*_nLits != '-') + local_30;
      }
      if (local_30 != 1) {
        return 0;
      }
    }
    pSop_local._4_4_ = 1;
  }
  else {
    pSop_local._4_4_ = 0;
  }
  return pSop_local._4_4_;
}

Assistant:

int Abc_SopIsOrType( char * pSop )
{
    char * pCube, * pCur;
    int nVars, nLits;
    nVars = Abc_SopGetVarNum( pSop );
    if ( nVars != Abc_SopGetCubeNum(pSop) )
        return 0;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        // count the number of literals in the cube
        nLits = 0;
        for ( pCur = pCube; *pCur != ' '; pCur++ )
            nLits += ( *pCur != '-' );
        if ( nLits != 1 )
            return 0;
    }
    return 1;
}